

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O1

stale_regions *
filemgr_actual_stale_regions
          (stale_regions *__return_storage_ptr__,filemgr *file,bid_t offset,size_t length)

{
  filemgr_magic_t magic;
  long lVar1;
  list_elem *plVar2;
  list_elem *plVar3;
  void *buf;
  filemgr *file_00;
  bool bVar4;
  ulong bid;
  ulong uVar5;
  stale_data *psVar6;
  anon_union_40_2_882dd8ce_for_stale_regions_1 *paVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  size_t sVar13;
  undefined8 uStack_70;
  void *local_68;
  filemgr *local_60;
  ulong local_58;
  anon_union_40_2_882dd8ce_for_stale_regions_1 *local_50;
  ulong local_48;
  stale_regions *local_40;
  ulong local_38;
  
  local_38 = (ulong)file->blocksize;
  lVar12 = -(local_38 + 0xf & 0xfffffffffffffff0);
  local_68 = (void *)((long)&local_68 + lVar12);
  magic = file->version;
  *(undefined8 *)((long)&uStack_70 + lVar12) = 0x12f040;
  bVar4 = ver_non_consecutive_doc(magic);
  local_40 = __return_storage_ptr__;
  if (bVar4) {
    if (length == 0) {
      sVar13 = 0;
    }
    else {
      bid = offset / file->blocksize;
      uVar9 = offset % (ulong)file->blocksize;
      uVar5 = local_38 - 0x10;
      lVar10 = 0;
      local_50 = &__return_storage_ptr__->field_1;
      sVar13 = 0;
      uVar11 = local_38;
      local_60 = file;
      local_58 = length;
      local_48 = uVar5;
      do {
        paVar7 = local_50;
        if (sVar13 != 0) {
          if (sVar13 == 1) {
            uVar5 = local_58 / uVar5;
            *(undefined8 *)((long)&uStack_70 + lVar12) = 0x12f0ad;
            psVar6 = (stale_data *)calloc(uVar5 + 2,0x28);
            lVar1 = *(long *)((long)local_50 + 8);
            plVar2 = *(list_elem **)((long)local_50 + 0x10);
            plVar3 = *(list_elem **)((long)local_50 + 0x18);
            psVar6->pos = (uint64_t)local_50->regions;
            *(long *)&psVar6->len = lVar1;
            (psVar6->field_2).le.prev = plVar2;
            (psVar6->field_2).le.next = plVar3;
            (psVar6->field_2).avl.right = *(avl_node **)((long)local_50 + 0x20);
            local_50->regions = psVar6;
            uVar11 = local_38;
            uVar5 = local_48;
          }
          paVar7 = (anon_union_40_2_882dd8ce_for_stale_regions_1 *)
                   ((long)&((local_40->field_1).regions)->pos + lVar10);
        }
        file_00 = local_60;
        buf = local_68;
        paVar7->regions = (stale_data *)(bid * uVar11 + uVar9);
        uVar8 = length - (uVar5 - uVar9);
        if (length < uVar5 - uVar9) {
          (paVar7->region).len = (uint32_t)length;
          uVar8 = 0;
        }
        else {
          (paVar7->region).len = (int)uVar11 - (int)uVar9;
        }
        if (uVar8 != 0) {
          *(undefined8 *)((long)&uStack_70 + lVar12) = 0x12f12c;
          filemgr_read(file_00,bid,buf,(err_log_callback *)0x0,true);
          uVar5 = *(ulong *)((long)buf + local_48);
          bid = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 |
                (uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 |
                (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28 |
                uVar5 << 0x38;
          uVar9 = 0;
          uVar11 = local_38;
          uVar5 = local_48;
        }
        lVar10 = lVar10 + 0x28;
        sVar13 = sVar13 + 1;
        length = uVar8;
      } while (uVar8 != 0);
    }
    local_40->n_regions = sVar13;
  }
  else {
    __return_storage_ptr__->n_regions = 1;
    (__return_storage_ptr__->field_1).region.pos = offset;
    uVar5 = (ulong)file->blocksize;
    lVar12 = ((length + offset) / uVar5 - offset / uVar5) + length;
    (__return_storage_ptr__->field_1).region.len =
         (uint)((int)((offset + lVar12) % uVar5) == file->blocksize - 1) + (int)lVar12;
  }
  return local_40;
}

Assistant:

struct stale_regions filemgr_actual_stale_regions(struct filemgr *file,
                                                  bid_t offset,
                                                  size_t length)
{
    uint8_t *buf = alca(uint8_t, file->blocksize);
    size_t remaining = length;
    size_t real_blocksize = file->blocksize;
    size_t blocksize = real_blocksize;
    size_t cur_pos, space_in_block, count;
    bid_t cur_bid;
    bool non_consecutive = ver_non_consecutive_doc(file->version);
    struct docblk_meta blk_meta;
    struct stale_regions ret;
    struct stale_data *arr = NULL, *cur_region;

    if (non_consecutive) {
        blocksize -= DOCBLK_META_SIZE;

        cur_bid = offset / file->blocksize;
        // relative position in the block 'cur_bid'
        cur_pos = offset % file->blocksize;

        count = 0;
        while (remaining) {
            if (count == 1) {
                // more than one stale region .. allocate array
                size_t arr_size = (length / blocksize) + 2;
                arr = (struct stale_data *)calloc(arr_size, sizeof(struct stale_data));
                arr[0] = ret.region;
                ret.regions = arr;
            }

            if (count == 0) {
                // Since n_regions will be 1 in most cases,
                // we do not allocate heap memory when 'n_regions==1'.
                cur_region = &ret.region;
            } else {
                cur_region = &ret.regions[count];
            }
            cur_region->pos = (cur_bid * real_blocksize) + cur_pos;

            // subtract data size in the current block
            space_in_block = blocksize - cur_pos;
            if (space_in_block <= remaining) {
                // rest of the current block (including block meta)
                cur_region->len = real_blocksize - cur_pos;
                remaining -= space_in_block;
            } else {
                cur_region->len = remaining;
                remaining = 0;
            }
            count++;

            if (remaining) {
                // get next BID
                filemgr_read(file, cur_bid, (void *)buf, NULL, true);
                memcpy(&blk_meta, buf + blocksize, sizeof(blk_meta));
                cur_bid = _endian_decode(blk_meta.next_bid);
                cur_pos = 0; // beginning of the block
            }
        }
        ret.n_regions = count;

    } else {
        // doc blocks are consecutive .. always return a single region.
        ret.n_regions = 1;
        ret.region.pos = offset;
        ret.region.len = filemgr_actual_stale_length(file, offset, length);
    }

    return ret;
}